

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itree.c
# Opt level: O0

cell_index_t itree_find(itree_t *t,cell_index_t *end,cell_index_t start,cell_id_t id)

{
  cell_t *pcVar1;
  bool bVar2;
  cell_index_t local_34;
  cell_index_t local_30;
  cell_index_t o;
  cell_index_t l;
  cell_index_t i;
  cell_t *cell;
  cell_id_t id_local;
  cell_index_t start_local;
  cell_index_t *end_local;
  itree_t *t_local;
  
  local_30 = 0xffffffff;
  pcVar1 = t->cell;
  o = start;
  if (pcVar1[start].id == 0xffffffff) {
    local_34 = 0xffffffff;
    local_30 = start;
  }
  else {
    while( true ) {
      bVar2 = false;
      if (o != 0xffffffff) {
        bVar2 = pcVar1[o].id != id;
      }
      if (!bVar2) break;
      local_30 = o;
      o = pcVar1[o].sib;
    }
    if (o == 0xffffffff) {
      local_34 = 0xffffffff;
    }
    else {
      local_34 = o;
    }
  }
  *end = local_30;
  return local_34;
}

Assistant:

cell_index_t itree_find(itree_t *t,
			cell_index_t *end,
			cell_index_t start,
			cell_id_t id)
{
    cell_t *cell;
    cell_index_t i, l = NO_ID, o;
    
    cell = t->cell;

    if (cell[start].id != NO_ID) {
	for (i = start; (i != NO_ID) && (cell[i].id != id); i = cell[i].sib)
	    l = i;

	if (i != NO_ID)
	    o = i;
	else 
	    o = NULL_INDEX;
    }
    else {
	o = NULL_INDEX;
	l = start;
    }

    *end = l;

    return o;
}